

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O2

CppTypeName * __thiscall
capnp::anon_unknown_1::CapnpcCppMain::cppFullName
          (CppTypeName *__return_storage_ptr__,CapnpcCppMain *this,Schema schema,Schema brand,
          Maybe<capnp::InterfaceSchema::Method> *method)

{
  bool bVar1;
  Reader brand_00;
  undefined1 auVar2 [40];
  Reader proto;
  Reader proto_00;
  Reader proto_01;
  NullableValue<capnp::InterfaceSchema::Method> *pNVar3;
  CapTableReader *pCVar4;
  ListElementCount LVar5;
  ListElementCount LVar6;
  long lVar7;
  size_t sVar8;
  long lVar9;
  size_t sVar10;
  uint64_t annotationId;
  char (*params_00) [2];
  uint64_t scopeId;
  CapnpcCppMain *this_00;
  Iterator iter;
  uint index;
  char *pcVar11;
  ArrayPtr<const_char> innerName;
  __ireturn_type _Var12;
  StringPtr SVar13;
  Type type;
  StringPtr name;
  ulong local_248;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *local_240;
  Array<capnp::(anonymous_namespace)::CppTypeName> result;
  BrandArgumentList args;
  Schema parent;
  Schema brand_local;
  Reader node;
  Reader nested;
  String ownUnqualifiedName;
  NullableValue<capnp::schema::Value::Reader> ns;
  Reader params;
  Fault f;
  anon_union_64_1_a8c68091_for_NullableValue<capnp::InterfaceSchema::Method>_2 local_f8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  Schema schema_local;
  Maybe<capnp::InterfaceSchema::Method> local_78;
  
  brand_local = brand;
  schema_local = schema;
  Schema::getProto(&node,&schema_local);
  if (node._reader.dataSize < 0xc0) {
    if (0x6f < node._reader.dataSize) goto LAB_0018a16c;
    if (node._reader.dataSize < 0x40) {
      f.exception = (Exception *)0x0;
      goto LAB_0018a239;
    }
  }
  else {
    if (*(uint64_t *)((long)node._reader.data + 0x10) != 0) {
      local_98 = 0;
      local_b8 = 0;
      uStack_b0 = 0;
      local_a8 = 0;
      uStack_a0 = 0;
      uStack_90 = 0x7fffffff;
      auVar2 = ZEXT1640(ZEXT816(0));
      brand_00._reader._40_8_ = 0x7fffffff;
      brand_00._reader.segment = (SegmentReader *)auVar2._0_8_;
      brand_00._reader.capTable = (CapTableReader *)auVar2._8_8_;
      brand_00._reader.data = (void *)auVar2._16_8_;
      brand_00._reader.pointers = (WirePointer *)auVar2._24_8_;
      brand_00._reader.dataSize = auVar2._32_4_;
      brand_00._reader.pointerCount = auVar2._36_2_;
      brand_00._reader._38_2_ = auVar2._38_2_;
      parent = SchemaLoader::get(&this->schemaLoader,*(uint64_t *)((long)node._reader.data + 0x10),
                                 brand_00,(Schema)0x2a5320);
      ownUnqualifiedName.content.ptr = (char *)0x0;
      ownUnqualifiedName.content.size_ = 0;
      ownUnqualifiedName.content.disposer = (ArrayDisposer *)0x0;
      proto._reader.pointerCount = node._reader.pointerCount;
      proto._reader._38_2_ = node._reader._38_2_;
      proto._reader.dataSize = node._reader.dataSize;
      proto._reader.capTable = node._reader.capTable;
      proto._reader.segment = node._reader.segment;
      proto._reader.data = node._reader.data;
      proto._reader.pointers = node._reader.pointers;
      proto._reader.nestingLimit = node._reader.nestingLimit;
      proto._reader._44_4_ = node._reader._44_4_;
      annotationValue<capnp::schema::Node::Reader>
                ((Maybe<capnp::schema::Value::Reader> *)&ns,(CapnpcCppMain *)0xf264a779fef191ce,
                 proto,annotationId);
      f.exception._0_1_ = ns.isSet;
      if (ns.isSet == true) {
        local_f8.value.proto._reader.data = (void *)ns.field_1._32_8_;
        local_f8.value.proto._reader.pointers = (WirePointer *)ns.field_1._40_8_;
        local_f8.value.proto._reader.segment = (SegmentReader *)ns.field_1.value._reader.data;
        local_f8.value.proto._reader.capTable = (CapTableReader *)ns.field_1.value._reader.pointers;
        local_f8.value.parent.super_Schema.raw =
             (InterfaceSchema)(InterfaceSchema)ns.field_1.value._reader.segment;
        local_f8._8_8_ = ns.field_1.value._reader.capTable;
        innerName = (ArrayPtr<const_char>)
                    capnp::schema::Value::Reader::getText((Reader *)&local_f8.value);
LAB_0018a4c5:
        local_78.ptr.isSet = (method->ptr).isSet;
        if (local_78.ptr.isSet == true) {
          local_78.ptr.field_1.value.parent.super_Schema.raw =
               (InterfaceSchema)(method->ptr).field_1.value.parent.super_Schema.raw;
          local_78.ptr.field_1._8_8_ = *(undefined8 *)((long)&(method->ptr).field_1 + 8);
          local_78.ptr.field_1.value.proto._reader.segment =
               (method->ptr).field_1.value.proto._reader.segment;
          local_78.ptr.field_1.value.proto._reader.capTable =
               (method->ptr).field_1.value.proto._reader.capTable;
          local_78.ptr.field_1.value.proto._reader.data =
               (method->ptr).field_1.value.proto._reader.data;
          local_78.ptr.field_1.value.proto._reader.pointers =
               (method->ptr).field_1.value.proto._reader.pointers;
          pNVar3 = &method->ptr;
          local_78.ptr.field_1._48_4_ = *(StructDataBitCount *)((long)&pNVar3->field_1 + 0x30);
          local_78.ptr.field_1._52_2_ = *(StructPointerCount *)((long)&pNVar3->field_1 + 0x34);
          local_78.ptr.field_1._54_2_ = *(undefined2 *)((long)&pNVar3->field_1 + 0x36);
          local_78.ptr.field_1._56_8_ =
               *(undefined8 *)&(method->ptr).field_1.value.proto._reader.nestingLimit;
        }
        cppFullName(__return_storage_ptr__,this,parent,brand,&local_78);
        capnp::schema::Node::Reader::getParameters(&params,&node);
        if (params.reader.elementCount == 0) {
          CppTypeName::addMemberType(__return_storage_ptr__,(StringPtr)innerName);
        }
        else {
          if (node._reader.dataSize < 0x40) {
            scopeId = 0;
          }
          else {
            scopeId = *node._reader.data;
          }
          Schema::getBrandArgumentsAtScope(&args,&brand_local,scopeId);
          kj::heapArrayBuilder<capnp::(anonymous_namespace)::CppTypeName>
                    ((ArrayBuilder<capnp::(anonymous_namespace)::CppTypeName> *)&nested,
                     (ulong)params.reader.elementCount);
          for (index = 0; params.reader.elementCount != index; index = index + 1) {
            type = Schema::BrandArgumentList::operator[](&args,index);
            bVar1 = (method->ptr).isSet;
            f.exception._0_1_ = bVar1;
            if (bVar1 == true) {
              local_f8.value.parent.super_Schema.raw =
                   (InterfaceSchema)(method->ptr).field_1.value.parent.super_Schema.raw;
              local_f8._8_8_ = *(undefined8 *)((long)&(method->ptr).field_1 + 8);
              local_f8.value.proto._reader.segment =
                   (method->ptr).field_1.value.proto._reader.segment;
              local_f8.value.proto._reader.capTable =
                   (method->ptr).field_1.value.proto._reader.capTable;
              local_f8.value.proto._reader.data = (method->ptr).field_1.value.proto._reader.data;
              local_f8.value.proto._reader.pointers =
                   (method->ptr).field_1.value.proto._reader.pointers;
              pNVar3 = &method->ptr;
              local_f8._48_4_ = *(StructDataBitCount *)((long)&pNVar3->field_1 + 0x30);
              local_f8._52_2_ = *(StructPointerCount *)((long)&pNVar3->field_1 + 0x34);
              local_f8._54_2_ = *(undefined2 *)((long)&pNVar3->field_1 + 0x36);
              local_f8._56_8_ =
                   *(undefined8 *)&(method->ptr).field_1.value.proto._reader.nestingLimit;
            }
            typeName((CppTypeName *)&ns,this,type,(Maybe<capnp::InterfaceSchema::Method> *)&f);
            pCVar4 = nested._reader.capTable;
            CppTypeName::CppTypeName((CppTypeName *)nested._reader.capTable,(CppTypeName *)&ns);
            nested._reader.capTable = pCVar4 + 8;
            kj::StringTree::~StringTree((StringTree *)&ns);
          }
          result.size_ = (long)nested._reader.capTable - (long)nested._reader.segment >> 6;
          result.ptr = (CppTypeName *)nested._reader.segment;
          result.disposer = (ArrayDisposer *)nested._reader.pointers;
          nested._reader.segment = (SegmentReader *)0x0;
          nested._reader.capTable = (CapTableReader *)0x0;
          nested._reader.data = (void *)0x0;
          kj::ArrayBuilder<capnp::(anonymous_namespace)::CppTypeName>::~ArrayBuilder
                    ((ArrayBuilder<capnp::(anonymous_namespace)::CppTypeName> *)&nested);
          CppTypeName::addMemberTemplate(__return_storage_ptr__,(StringPtr)innerName,&result);
          kj::Array<capnp::(anonymous_namespace)::CppTypeName>::~Array(&result);
        }
        kj::Array<char>::~Array(&ownUnqualifiedName.content);
        return __return_storage_ptr__;
      }
      Schema::getProto((Reader *)&ns,&parent);
      capnp::schema::Node::Reader::getNestedNodes((Reader *)&params,(Reader *)&ns);
      LVar5 = params.reader.elementCount;
      args.scopeId = (uint64_t)&params;
      for (args.size_ = 0; args.size_ != LVar5; args.size_ = args.size_ + 1) {
        _::
        IndexingIterator<const_capnp::List<capnp::schema::Node::NestedNode,_(capnp::Kind)3>::Reader,_capnp::schema::Node::NestedNode::Reader>
        ::operator*(&nested,(IndexingIterator<const_capnp::List<capnp::schema::Node::NestedNode,_(capnp::Kind)3>::Reader,_capnp::schema::Node::NestedNode::Reader>
                             *)&args);
        if (nested._reader.dataSize < 0x40) {
          lVar7 = 0;
        }
        else {
          lVar7 = *nested._reader.data;
        }
        if (node._reader.dataSize < 0x40) {
          lVar9 = 0;
        }
        else {
          lVar9 = *node._reader.data;
        }
        if (lVar7 == lVar9) {
          innerName = (ArrayPtr<const_char>)
                      capnp::schema::Node::NestedNode::Reader::getName(&nested);
          if (innerName.size_ < 2) goto LAB_0018a34c;
          goto LAB_0018a4c5;
        }
      }
      innerName.size_ = 1;
      innerName.ptr = "";
LAB_0018a34c:
      if ((0x6f < (uint)ns.field_1._24_4_) &&
         (*(short *)((long)&ns.field_1.value._reader.capTable[1]._vptr_CapTableReader + 4) == 1)) {
        nested._reader.segment = (SegmentReader *)CONCAT71(ns._1_7_,ns.isSet);
        nested._reader._32_8_ = ns.field_1.value._reader.pointers;
        nested._reader._40_8_ = ns.field_1._32_8_;
        nested._reader.data = ns.field_1.value._reader.capTable;
        nested._reader.pointers = (WirePointer *)ns.field_1.value._reader.data;
        nested._reader.capTable = (CapTableReader *)ns.field_1.value._reader.segment;
        capnp::schema::Node::Struct::Reader::getFields((Reader *)&params,(Reader *)&nested);
        LVar5 = params.reader.elementCount;
        result.size_ = result.size_ & 0xffffffff00000000;
        LVar6 = 0;
        result.ptr = (CppTypeName *)&params;
        while (LVar6 != LVar5) {
          this_00 = (CapnpcCppMain *)&nested;
          _::
          IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
          ::operator*((Reader *)&nested,
                      (IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
                       *)&result);
          if ((0x4f < nested._reader.dataSize) && (*(short *)((long)nested._reader.data + 8) == 1))
          {
            if (nested._reader.dataSize < 0xc0) {
              sVar8 = 0;
            }
            else {
              sVar8 = *(size_t *)((long)nested._reader.data + 0x10);
            }
            if (node._reader.dataSize < 0x40) {
              sVar10 = 0;
            }
            else {
              sVar10 = *node._reader.data;
            }
            if (sVar8 == sVar10) {
              proto_01._reader.capTable = nested._reader.capTable;
              proto_01._reader.segment = nested._reader.segment;
              proto_01._reader.data = nested._reader.data;
              proto_01._reader.pointers = nested._reader.pointers;
              proto_01._reader.dataSize = nested._reader.dataSize;
              proto_01._reader.pointerCount = nested._reader.pointerCount;
              proto_01._reader._38_2_ = nested._reader._38_2_;
              proto_01._reader.nestingLimit = nested._reader.nestingLimit;
              proto_01._reader._44_4_ = nested._reader._44_4_;
              SVar13 = protoName<capnp::schema::Field::Reader>(this_00,proto_01);
              name.content.ptr = (char *)SVar13.content.size_;
              name.content.size_ = sVar10;
              toTitleCase((String *)&args,(CapnpcCppMain *)SVar13.content.ptr,name);
              kj::Array<char>::operator=(&ownUnqualifiedName.content,(Array<char> *)&args);
              kj::Array<char>::~Array((Array<char> *)&args);
              pcVar11 = "";
              if (ownUnqualifiedName.content.size_ != 0) {
                pcVar11 = ownUnqualifiedName.content.ptr;
              }
              innerName.size_ =
                   ownUnqualifiedName.content.size_ + (ownUnqualifiedName.content.size_ == 0);
              innerName.ptr = pcVar11;
              break;
            }
          }
          LVar6 = (int)result.size_ + 1;
          result.size_ = CONCAT44(result.size_._4_4_,LVar6);
        }
        local_248 = innerName.size_;
        brand.raw = brand_local.raw;
        if (1 < local_248) goto LAB_0018a4c5;
      }
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[73]>
                ((Fault *)&params,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/capnpc-c++.c++"
                 ,0x19b,FAILED,"unqualifiedName != nullptr",
                 "\"A schema Node\'s supposed scope did not contain the node as a NestedNode.\"",
                 (char (*) [73])
                 "A schema Node\'s supposed scope did not contain the node as a NestedNode.");
      kj::_::Debug::Fault::fatal((Fault *)&params);
    }
LAB_0018a16c:
    if (*(short *)((long)node._reader.data + 0xc) != 0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[72]>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/capnpc-c++.c++"
                 ,0x174,FAILED,"node.isFile()",
                 "\"Non-file had scopeId zero; perhaps it\'s a method param / result struct?\"",
                 (char (*) [72])
                 "Non-file had scopeId zero; perhaps it\'s a method param / result struct?");
      kj::_::Debug::Fault::fatal(&f);
    }
  }
  f.exception = *node._reader.data;
LAB_0018a239:
  local_240 = &this->usedImports;
  _Var12 = std::__detail::
           _Insert<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
           ::insert((_Insert<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                     *)local_240,(value_type *)&f);
  proto_00._reader.pointerCount = node._reader.pointerCount;
  proto_00._reader._38_2_ = node._reader._38_2_;
  proto_00._reader.dataSize = node._reader.dataSize;
  proto_00._reader.capTable = node._reader.capTable;
  proto_00._reader.segment = node._reader.segment;
  proto_00._reader.data = node._reader.data;
  proto_00._reader.pointers = node._reader.pointers;
  proto_00._reader.nestingLimit = node._reader.nestingLimit;
  proto_00._reader._44_4_ = node._reader._44_4_;
  annotationValue<capnp::schema::Node::Reader>
            ((Maybe<capnp::schema::Value::Reader> *)&f,(CapnpcCppMain *)0xb9c6f99ebf805f2c,proto_00,
             _Var12._8_8_);
  ns.isSet = (bool)(char)f.exception;
  if ((char)f.exception == '\x01') {
    ns.field_1._32_8_ = local_f8.value.proto._reader.data;
    ns.field_1._40_8_ = local_f8.value.proto._reader.pointers;
    ns.field_1.value._reader.data = local_f8.value.proto._reader.segment;
    ns.field_1.value._reader.pointers = (WirePointer *)local_f8.value.proto._reader.capTable;
    ns.field_1.value._reader.segment = (SegmentReader *)local_f8.value.parent.super_Schema.raw;
    ns.field_1.value._reader.capTable = (CapTableReader *)local_f8._8_8_;
    capnp::schema::Value::Reader::getText(&ns.field_1.value);
    SVar13.content.size_ = (size_t)node._reader.segment;
    SVar13.content.ptr = (char *)0x18a2d8;
    CppTypeName::makeNamespace(SVar13);
  }
  else {
    kj::strTree<char_const(&)[2]>((StringTree *)&f,(kj *)0x23fc45,params_00);
    CppTypeName::CppTypeName(__return_storage_ptr__,(StringTree *)&f,false);
    kj::StringTree::~StringTree((StringTree *)&f);
  }
  return __return_storage_ptr__;
}

Assistant:

CppTypeName cppFullName(Schema schema, Schema brand, kj::Maybe<InterfaceSchema::Method> method) {
    auto node = schema.getProto();

    if (node.getScopeId() == 0) {
      // This is the file-level scope. Search for the namespace annotation.
      KJ_REQUIRE(node.isFile(),
          "Non-file had scopeId zero; perhaps it's a method param / result struct?");
      usedImports.insert(node.getId());
      KJ_IF_MAYBE(ns, annotationValue(node, NAMESPACE_ANNOTATION_ID)) {
        return CppTypeName::makeNamespace(ns->getText());
      } else {
        return CppTypeName::makeRoot();
      }
    }